

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  Curl_addrinfo *pCVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  int iVar8;
  CURLcode CVar9;
  _Bool _Var10;
  uint uVar11;
  CURLcode CVar12;
  CURLcode CVar13;
  timediff_t tVar14;
  int *piVar15;
  char *pcVar16;
  Curl_easy *pCVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  curltime cVar22;
  curltime newer;
  curltime older;
  curltime older_00;
  int error;
  char ipaddress [46];
  char buffer [128];
  int local_128;
  CURLcode local_124;
  int local_120;
  CURLcode local_11c;
  long local_118;
  curltime local_110;
  _Bool *local_100;
  Curl_easy *local_f8;
  ulong local_f0;
  char local_e8 [48];
  char local_b8 [136];
  
  pCVar17 = conn->data;
  local_128 = 0;
  *connected = false;
  local_118 = (long)sockindex;
  if ((conn->bits).tcpconnect[local_118] == true) {
    *connected = true;
  }
  else {
    cVar22 = Curl_now();
    local_110.tv_sec = cVar22.tv_sec;
    local_110.tv_usec = cVar22.tv_usec;
    local_f0 = Curl_timeleft(pCVar17,&local_110,true);
    if ((long)local_f0 < 0) {
      Curl_failf(pCVar17,"Connection time-out");
      return CURLE_OPERATION_TIMEDOUT;
    }
    lVar19 = -1;
    local_124 = CURLE_OK;
    local_120 = sockindex;
    local_100 = connected;
    local_f8 = pCVar17;
    do {
      if (conn->tempsock[lVar19 + 1] == -1) {
        iVar21 = 6;
        CVar13 = local_124;
        CVar9 = local_11c;
      }
      else {
        uVar18 = (int)lVar19 + 1U ^ 1;
        uVar11 = Curl_socket_check(-1,-1,conn->tempsock[lVar19 + 1],0);
        if (uVar11 == 2) {
LAB_0046fdc7:
          _Var10 = verifyconnect(conn->tempsock[lVar19 + 1],&local_128);
          if (_Var10) {
            conn->sock[local_118] = conn->tempsock[lVar19 + 1];
            pCVar1 = conn->tempaddr[lVar19 + 1];
            conn->ip_addr = pCVar1;
            conn->tempsock[lVar19 + 1] = -1;
            *(uint *)&(conn->bits).field_0x4 =
                 *(uint *)&(conn->bits).field_0x4 & 0xfffffbff |
                 (uint)(pCVar1->ai_family == 10) << 10;
            if (conn->tempsock[uVar18] != -1) {
              Curl_closesocket(conn,conn->tempsock[uVar18]);
              conn->tempsock[uVar18] = -1;
            }
            iVar8 = local_120;
            CVar13 = Curl_connected_proxy(conn,local_120);
            iVar21 = 1;
            CVar9 = CVar13;
            if (CVar13 == CURLE_OK) {
              (conn->bits).tcpconnect[local_118] = true;
              *local_100 = true;
              if (iVar8 == 0) {
                Curl_pgrsTime(pCVar17,TIMER_CONNECT);
              }
              Curl_updateconninfo(conn,conn->sock[local_118]);
              Curl_verboseconnect(conn);
              local_124 = CURLE_OK;
              local_11c = CURLE_OK;
              CVar13 = local_124;
              CVar9 = local_11c;
            }
            goto LAB_0046ffa5;
          }
          Curl_infof(pCVar17,"Connection failed\n");
        }
        else if (uVar11 == 0) {
          local_128 = 0;
          cVar22.tv_usec = local_110.tv_usec;
          cVar22.tv_sec = local_110.tv_sec;
          uVar4 = (conn->connecttime).tv_sec;
          uVar5 = (conn->connecttime).tv_usec;
          older.tv_usec = uVar5;
          older.tv_sec = uVar4;
          cVar22._12_4_ = 0;
          older._12_4_ = 0;
          tVar14 = Curl_timediff(cVar22,older);
          if (conn->timeoutms_per_addr <= tVar14) {
            Curl_infof(pCVar17,"After %ldms connect time, move on!\n");
            local_128 = 0x6e;
          }
          if (((lVar19 == -1) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
             (newer.tv_usec = local_110.tv_usec, newer.tv_sec = local_110.tv_sec,
             uVar6 = (conn->connecttime).tv_sec, uVar7 = (conn->connecttime).tv_usec,
             older_00.tv_usec = uVar7, older_00.tv_sec = uVar6, newer._12_4_ = 0,
             older_00._12_4_ = 0, tVar14 = Curl_timediff(newer,older_00),
             (pCVar17->set).happy_eyeballs_timeout <= tVar14)) {
            trynextip(conn,local_120,1);
          }
        }
        else {
          if (((conn->bits).field_0x7 & 8) != 0) goto LAB_0046fdc7;
          if ((uVar11 & 4) != 0) {
            verifyconnect(conn->tempsock[lVar19 + 1],&local_128);
          }
        }
        iVar8 = local_128;
        iVar20 = 0;
        iVar21 = 0;
        CVar13 = local_124;
        CVar9 = local_11c;
        if (local_128 != 0) {
          (pCVar17->state).os_errno = local_128;
          piVar15 = __errno_location();
          *piVar15 = iVar8;
          iVar21 = iVar20;
          CVar13 = local_124;
          CVar9 = local_11c;
          if (conn->tempaddr[lVar19 + 1] != (Curl_addrinfo *)0x0) {
            Curl_printable_address(conn->tempaddr[lVar19 + 1],local_e8,0x2e);
            lVar2 = conn->port;
            pcVar16 = Curl_strerror(local_128,local_b8,0x80);
            Curl_infof(pCVar17,"connect to %s port %ld failed: %s\n",local_e8,lVar2,pcVar16);
            conn->timeoutms_per_addr =
                 local_f0 >> (conn->tempaddr[lVar19 + 1]->ai_next != (Curl_addrinfo *)0x0);
            CVar12 = trynextip(conn,local_120,(int)lVar19 + 1);
            pCVar17 = local_f8;
            CVar9 = local_11c;
            if ((CVar12 != CURLE_COULDNT_CONNECT) ||
               (CVar13 = local_124, conn->tempsock[uVar18] == -1)) {
              CVar13 = CVar12;
            }
          }
        }
      }
LAB_0046ffa5:
      local_11c = CVar9;
      local_124 = CVar13;
      if ((iVar21 != 6) && (iVar21 != 0)) {
        return local_11c;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 == 0);
    if (local_124 != CURLE_OK) {
      CVar13 = local_124;
      if ((conn->tempaddr[1] == (Curl_addrinfo *)0x0) &&
         (CVar13 = trynextip(conn,local_120,1), CVar13 == CURLE_OK)) {
        return CURLE_OK;
      }
      uVar11 = *(uint *)&(conn->bits).field_0x4;
      lVar19 = 0x120;
      if (((uVar11 & 0x40) == 0) &&
         ((lVar19 = 0x160, (uVar11 & 0x20) == 0 && (lVar19 = 0x100, (uVar11 & 4) == 0)))) {
        lVar19 = 0xd0;
      }
      uVar3 = *(undefined8 *)((conn->chunk).hexbuffer + lVar19 + -0x20);
      lVar19 = conn->port;
      pcVar16 = Curl_strerror(local_128,local_b8,0x80);
      Curl_failf(pCVar17,"Failed to connect to %s port %ld: %s",uVar3,lVar19,pcVar16);
      return CVar13;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  timediff_t allow;
  int error = 0;
  struct curltime now;
  int rc;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_now();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  for(i = 0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    rc = SOCKET_WRITABLE(conn->tempsock[i], 0);

    if(rc == 0) { /* no connection yet */
      error = 0;
      if(Curl_timediff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %ldms connect time, move on!\n",
              conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         (Curl_timediff(now, conn->connecttime) >=
          data->set.happy_eyeballs_timeout)) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
        conn->bits.ipv6 = (conn->ip_addr->ai_family == AF_INET6)?TRUE:FALSE;
#endif

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to do any proxy magic first once we connected */
        result = Curl_connected_proxy(conn, sockindex);
        if(result)
          return result;

        conn->bits.tcpconnect[sockindex] = TRUE;

        *connected = TRUE;
        if(sockindex == FIRSTSOCKET)
          Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
        Curl_updateconninfo(conn, conn->sock[sockindex]);
        Curl_verboseconnect(conn);

        return CURLE_OK;
      }
      infof(data, "Connection failed\n");
    }
    else if(rc & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
        char ipaddress[MAX_IPADR_LEN];
        char buffer[STRERROR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port,
              Curl_strerror(error, buffer, sizeof(buffer)));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
                                   allow : allow / 2;

        status = trynextip(conn, sockindex, i);
        if(status != CURLE_COULDNT_CONNECT
            || conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result) {
    /* no more addresses to try */
    const char *hostname;
    char buffer[STRERROR_LEN];

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      result = trynextip(conn, sockindex, 1);
      if(!result)
        return result;
    }

    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %ld: %s",
          hostname, conn->port,
          Curl_strerror(error, buffer, sizeof(buffer)));
  }

  return result;
}